

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O1

bool __thiscall FileWriter::tryWrite(FileWriter *this,string *path)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  stat st;
  string local_c8;
  stat local_a8;
  
  lVar2 = std::__cxx11::string::rfind((char)path,0x2f);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_c8,(ulong)path);
    util::mkdirp(&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = stat((path->_M_dataplus)._M_p,&local_a8);
  if ((iVar1 < 0) && (piVar3 = __errno_location(), *piVar3 == 2)) {
    return true;
  }
  return this->force_;
}

Assistant:

bool FileWriter::tryWrite(const std::string& path) {
  struct stat st;

  auto rpos = path.rfind('/');
  if (rpos != std::string::npos) {
    mkdirp(path.substr(0, rpos));
  }

  auto rv = stat(path.c_str(), &st);
  if (rv < 0 && errno == ENOENT) {
    return true;
  }

  return force_;
}